

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cpp
# Opt level: O1

void process_header(HttpRequest *req,HttpResponse *res)

{
  char *__nptr;
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  pointer psVar7;
  int *piVar8;
  long lVar9;
  HttpResponse *pHVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  uint __len;
  sregex_iterator iter;
  sregex_iterator end;
  vector<int,_std::allocator<int>_> tokens;
  string range;
  regex e;
  int local_13c;
  undefined1 local_138 [32];
  pointer local_118;
  pointer local_110;
  pointer local_108;
  undefined1 local_f8 [32];
  pointer local_d8;
  pointer psStack_d0;
  pointer local_c8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_c0;
  vector<int,_std::allocator<int>_> local_b8;
  char *local_98;
  undefined8 local_90;
  char local_88;
  undefined7 uStack_87;
  char *local_78;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  long local_68;
  long local_60 [2];
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  for (p_Var6 = (req->_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(req->_headers)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    pHVar10 = (HttpResponse *)(p_Var6 + 1);
    iVar3 = std::__cxx11::string::compare((char *)pHVar10);
    if (iVar3 == 0) {
      local_70._M_current = (char *)local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,*(long *)(p_Var6 + 2),
                 (long)&(p_Var6[2]._M_parent)->_M_color + *(long *)(p_Var6 + 2));
      *(undefined1 *)((long)local_70._M_current + 5) = 0x20;
      std::__cxx11::string::append((char *)&local_70);
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&local_50,"\\d+",0x10);
      std::__cxx11::
      regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_138,local_70,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(local_70._M_current + local_68),&local_50,0);
      local_c8 = (pointer)0x0;
      _Stack_c0._M_current = (char *)0x0;
      local_d8 = (pointer)0x0;
      psStack_d0 = (pointer)0x0;
      local_f8._0_8_ = (char *)0x0;
      local_f8._8_4_ = 0;
      local_f8._12_4_ = 0;
      local_f8._16_4_ = 0;
      local_f8._20_4_ = 0;
      local_f8._24_4_ = 0;
      while (bVar2 = std::__cxx11::
                     regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                     ::operator==((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                   *)local_138,
                                  (regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                   *)local_f8), !bVar2) {
        lVar15 = 0;
        uVar13 = 0;
        while( true ) {
          if (local_118 == local_110) {
            uVar12 = 0;
          }
          else {
            uVar12 = ((long)local_110 - (long)local_118 >> 3) * -0x5555555555555555 - 3;
          }
          if (uVar12 <= uVar13) break;
          if (local_118 == local_110) {
            uVar12 = 0;
          }
          else {
            uVar12 = ((long)local_110 - (long)local_118 >> 3) * -0x5555555555555555 - 3;
          }
          if (uVar13 < uVar12) {
            psVar7 = (pointer)((long)&(local_118->
                                      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ).first._M_current + lVar15);
          }
          else {
            psVar7 = local_110 + -3;
          }
          local_98 = &local_88;
          if (psVar7->matched == true) {
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_98,
                       (psVar7->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).first._M_current,
                       (psVar7->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).second._M_current);
          }
          else {
            local_90 = 0;
            local_88 = '\0';
          }
          __nptr = local_98;
          piVar8 = __errno_location();
          iVar3 = *piVar8;
          *piVar8 = 0;
          lVar9 = strtol(__nptr,&local_78,10);
          if (local_78 == __nptr) goto LAB_00109608;
          iVar5 = (int)lVar9;
          if ((iVar5 != lVar9) || (*piVar8 == 0x22)) goto LAB_001095fc;
          if (*piVar8 == 0) {
            *piVar8 = iVar3;
          }
          local_13c = iVar5;
          if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_b8,
                       (iterator)
                       local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_13c);
          }
          else {
            *local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = iVar5;
            local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          if (local_98 != &local_88) {
            operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
          }
          uVar13 = uVar13 + 1;
          lVar15 = lVar15 + 0x18;
        }
        std::__cxx11::
        regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
        ::operator++((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                      *)local_138);
      }
      goto LAB_00109614;
    }
    iVar3 = std::__cxx11::string::compare((char *)pHVar10);
    if ((iVar3 == 0) && (iVar3 = std::__cxx11::string::compare((char *)(p_Var6 + 2)), iVar3 == 0)) {
LAB_00109545:
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"Connection","");
      local_f8._0_8_ = local_f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"Keep-Alive","");
      HttpResponse::addHeader(res,(string *)local_138,(string *)local_f8);
      goto LAB_0010959a;
    }
    if (res->isChunked == true) {
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"Transfer-Encoding","");
      local_f8._0_8_ = local_f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"chunked","");
      HttpResponse::addHeader(res,(string *)local_138,(string *)local_f8);
      pHVar10 = res;
      goto LAB_00109545;
    }
  }
  uVar4 = access(res->filename,4);
  printf("access:%d",(ulong)uVar4);
  iVar3 = access(res->filename,4);
  pHVar10 = res;
  if (iVar3 == 0) {
    return;
  }
LAB_0010959a:
  HttpResponse::setStCode(pHVar10,0x12e);
  local_138._0_8_ = local_138 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"Location","");
  local_f8._0_8_ = local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"/302.html","");
  HttpResponse::addHeader(res,(string *)local_138,(string *)local_f8);
LAB_001095fc:
  std::__throw_out_of_range("stoi");
LAB_00109608:
  std::__throw_invalid_argument("stoi");
LAB_00109614:
  if (local_d8 != (pointer)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  if (local_118 != (pointer)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
  HttpResponse::setStCode(res,0xce);
  res->is_range = true;
  res->start_pos =
       *local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start;
  res->end_pos = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
  local_138._0_8_ = local_138 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"Content-Length","");
  uVar14 = res->end_pos - res->start_pos;
  uVar4 = -uVar14;
  if (0 < (int)uVar14) {
    uVar4 = uVar14;
  }
  __len = 1;
  if (9 < uVar4) {
    uVar13 = (ulong)uVar4;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar11 = (uint)uVar13;
      if (uVar11 < 100) {
        __len = __len - 2;
        goto LAB_00109710;
      }
      if (uVar11 < 1000) {
        __len = __len - 1;
        goto LAB_00109710;
      }
      if (uVar11 < 10000) goto LAB_00109710;
      uVar13 = uVar13 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar11);
    __len = __len + 1;
  }
LAB_00109710:
  local_f8._0_8_ = local_f8 + 0x10;
  std::__cxx11::string::_M_construct((ulong)local_f8,(char)__len - (char)((int)uVar14 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_f8._0_8_ + (ulong)(uVar14 >> 0x1f)),__len,uVar4);
  pHVar10 = HttpResponse::addHeader(res,(string *)local_138,(string *)local_f8);
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,CONCAT44(local_f8._20_4_,local_f8._16_4_) + 1);
  }
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
  }
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((long *)local_70._M_current != local_60) {
    operator_delete(local_70._M_current,local_60[0] + 1);
  }
  _Unwind_Resume(pHVar10);
}

Assistant:

void process_header(HttpRequest &req, HttpResponse &res)
{
    map<string, string>::iterator iter;
    for (iter = req._headers.begin(); iter != req._headers.end(); ++iter) {
        if (iter->first.compare("Range") == 0) {
            // Range: bytes=0-1023
            string range = iter->second;
            range[5] = ' ';
            range.append("/");
            vector<int> tokens;
            getNumberByReg(range, tokens);
            res.setStCode(206);
            res.is_range = true;
            res.start_pos = tokens[0];
            res.end_pos = tokens[1];
            res.addHeader(CONTENT_LENGTH,
                          std::to_string(res.end_pos - res.start_pos));
            tokens.clear();
            res.addHeader("Accept-Ranges", "bytes");
            res.addHeader(
                CONTENT_RANGE,
                range.append(std::to_string(get_file_size(res.filename))));
        }
        if (iter->first.compare("Connection") == 0 &&
            iter->second.compare("Keep-Alive") == 0) {
            res.addHeader("Connection", "Keep-Alive");
            req.setKeepAlive(true);
        }
        if (res.IsChunked()) {
            res.addHeader("Transfer-Encoding", "chunked");
        }
    }
    printf("access:%d", accessable(res.filename));
    if (accessable(res.filename) != 0) {
        res.setStCode(302);
        res.addHeader("Location", "/302.html");
    }
}